

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

void __thiscall
ska::detailv3::
sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
::rehash(sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL> *pSVar1;
  EntryPointer begin;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int8_t iVar33;
  size_t sVar34;
  ulong uVar35;
  sherwood_v3_entry<slang::SVInt> *psVar36;
  ulong uVar37;
  sherwood_v3_entry<slang::SVInt> *result;
  long lVar38;
  sherwood_v3_entry<slang::SVInt> *psVar39;
  byte bVar40;
  ulong uVar41;
  undefined4 uVar42;
  double dVar43;
  undefined4 uVar45;
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar66;
  int iVar69;
  int iVar70;
  undefined1 auVar67 [16];
  int iVar71;
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar89;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  ulong local_38;
  
  auVar46._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_elements);
  auVar46._8_4_ = (int)(this->num_elements >> 0x20);
  auVar46._12_4_ = 0x45300000;
  auVar47._0_8_ = (double)this->_max_load_factor;
  auVar47._8_8_ = 0;
  dVar43 = ceil(((auVar46._8_8_ - 1.9342813113834067e+25) + (auVar46._0_8_ - 4503599627370496.0)) /
                auVar47._0_8_);
  local_38 = (long)(dVar43 - 9.223372036854776e+18) & (long)dVar43 >> 0x3f | (long)dVar43;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 == 0) {
    reset_to_empty_state(this);
    return;
  }
  iVar33 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
  sVar34 = this->num_slots_minus_one;
  if (sVar34 != 0) {
    sVar34 = sVar34 + 1;
  }
  if (local_38 != sVar34) {
    uVar35 = local_38 >> 1 | local_38;
    uVar35 = uVar35 >> 2 | uVar35;
    uVar35 = uVar35 >> 4 | uVar35;
    uVar35 = uVar35 >> 8 | uVar35;
    uVar35 = uVar35 >> 0x10 | uVar35;
    uVar35 = uVar35 >> 0x20 | uVar35;
    bVar40 = 4;
    if ('\x04' < (char)log2(unsigned_long)::table
                       [(uVar35 - (uVar35 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
      bVar40 = log2(unsigned_long)::table[(uVar35 - (uVar35 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
    }
    uVar41 = (ulong)bVar40;
    uVar35 = local_38 + uVar41;
    pSVar1 = (this->super_StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>).
             storage;
    psVar36 = pSVar1->ptr;
    if (((long)psVar36 - (long)pSVar1 >> 3) * 0x5555555555555555 + 8U < uVar35) {
      psVar36 = (sherwood_v3_entry<slang::SVInt> *)operator_new(uVar35 * 0x18);
    }
    else {
      pSVar1->ptr = psVar36 + uVar35;
    }
    auVar32 = _DAT_003e7450;
    auVar31 = _DAT_003e7440;
    auVar30 = _DAT_003e7430;
    auVar29 = _DAT_003e7420;
    auVar28 = _DAT_003e7410;
    auVar27 = _DAT_003e7400;
    auVar46 = _DAT_003e64d0;
    if (psVar36 != psVar36 + local_38 + (uVar41 - 1)) {
      uVar35 = (uVar41 + local_38) * 0x18 - 0x30;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar35;
      uVar42 = SUB164(auVar67 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
      uVar45 = (undefined4)(uVar35 / 0x180000000);
      auVar72._0_8_ = CONCAT44(uVar45,uVar42);
      auVar72._8_4_ = uVar42;
      auVar72._12_4_ = uVar45;
      auVar44._0_8_ = auVar72._0_8_ >> 4;
      auVar44._8_8_ = auVar72._8_8_ >> 4;
      uVar37 = 0;
      psVar39 = psVar36;
      do {
        auVar64._8_4_ = (int)uVar37;
        auVar64._0_8_ = uVar37;
        auVar64._12_4_ = (int)(uVar37 >> 0x20);
        auVar67 = auVar44 ^ auVar46;
        auVar72 = (auVar64 | auVar32) ^ auVar46;
        iVar66 = auVar67._0_4_;
        iVar85 = -(uint)(iVar66 < auVar72._0_4_);
        iVar69 = auVar67._4_4_;
        auVar74._4_4_ = -(uint)(iVar69 < auVar72._4_4_);
        iVar70 = auVar67._8_4_;
        iVar89 = -(uint)(iVar70 < auVar72._8_4_);
        iVar71 = auVar67._12_4_;
        auVar74._12_4_ = -(uint)(iVar71 < auVar72._12_4_);
        auVar13._4_4_ = iVar85;
        auVar13._0_4_ = iVar85;
        auVar13._8_4_ = iVar89;
        auVar13._12_4_ = iVar89;
        auVar47 = pshuflw(auVar47,auVar13,0xe8);
        auVar73._4_4_ = -(uint)(auVar72._4_4_ == iVar69);
        auVar73._12_4_ = -(uint)(auVar72._12_4_ == iVar71);
        auVar73._0_4_ = auVar73._4_4_;
        auVar73._8_4_ = auVar73._12_4_;
        auVar72 = pshuflw(in_XMM2,auVar73,0xe8);
        auVar74._0_4_ = auVar74._4_4_;
        auVar74._8_4_ = auVar74._12_4_;
        auVar67 = pshuflw(auVar47,auVar74,0xe8);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar48 = (auVar67 | auVar72 & auVar47) ^ auVar48;
        auVar47 = packssdw(auVar48,auVar48);
        if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar39->distance_from_desired = -1;
        }
        auVar14._4_4_ = iVar85;
        auVar14._0_4_ = iVar85;
        auVar14._8_4_ = iVar89;
        auVar14._12_4_ = iVar89;
        auVar74 = auVar73 & auVar14 | auVar74;
        auVar47 = packssdw(auVar74,auVar74);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar3,auVar47 ^ auVar3);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._0_4_ >> 8 & 1) != 0) {
          psVar39[1].distance_from_desired = -1;
        }
        auVar47 = (auVar64 | auVar31) ^ auVar46;
        auVar57._0_4_ = -(uint)(iVar66 < auVar47._0_4_);
        auVar57._4_4_ = -(uint)(iVar69 < auVar47._4_4_);
        auVar57._8_4_ = -(uint)(iVar70 < auVar47._8_4_);
        auVar57._12_4_ = -(uint)(iVar71 < auVar47._12_4_);
        auVar75._4_4_ = auVar57._0_4_;
        auVar75._0_4_ = auVar57._0_4_;
        auVar75._8_4_ = auVar57._8_4_;
        auVar75._12_4_ = auVar57._8_4_;
        iVar85 = -(uint)(auVar47._4_4_ == iVar69);
        iVar89 = -(uint)(auVar47._12_4_ == iVar71);
        auVar15._4_4_ = iVar85;
        auVar15._0_4_ = iVar85;
        auVar15._8_4_ = iVar89;
        auVar15._12_4_ = iVar89;
        auVar86._4_4_ = auVar57._4_4_;
        auVar86._0_4_ = auVar57._4_4_;
        auVar86._8_4_ = auVar57._12_4_;
        auVar86._12_4_ = auVar57._12_4_;
        auVar47 = auVar15 & auVar75 | auVar86;
        auVar47 = packssdw(auVar47,auVar47);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar4,auVar47 ^ auVar4);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._0_4_ >> 0x10 & 1) != 0) {
          psVar39[2].distance_from_desired = -1;
        }
        auVar47 = pshufhw(auVar47,auVar75,0x84);
        auVar16._4_4_ = iVar85;
        auVar16._0_4_ = iVar85;
        auVar16._8_4_ = iVar89;
        auVar16._12_4_ = iVar89;
        auVar72 = pshufhw(auVar57,auVar16,0x84);
        auVar67 = pshufhw(auVar47,auVar86,0x84);
        auVar49._8_4_ = 0xffffffff;
        auVar49._0_8_ = 0xffffffffffffffff;
        auVar49._12_4_ = 0xffffffff;
        auVar49 = (auVar67 | auVar72 & auVar47) ^ auVar49;
        auVar47 = packssdw(auVar49,auVar49);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._0_4_ >> 0x18 & 1) != 0) {
          psVar39[3].distance_from_desired = -1;
        }
        auVar47 = (auVar64 | auVar30) ^ auVar46;
        auVar58._0_4_ = -(uint)(iVar66 < auVar47._0_4_);
        auVar58._4_4_ = -(uint)(iVar69 < auVar47._4_4_);
        auVar58._8_4_ = -(uint)(iVar70 < auVar47._8_4_);
        auVar58._12_4_ = -(uint)(iVar71 < auVar47._12_4_);
        auVar17._4_4_ = auVar58._0_4_;
        auVar17._0_4_ = auVar58._0_4_;
        auVar17._8_4_ = auVar58._8_4_;
        auVar17._12_4_ = auVar58._8_4_;
        auVar72 = pshuflw(auVar86,auVar17,0xe8);
        auVar50._0_4_ = -(uint)(auVar47._0_4_ == iVar66);
        auVar50._4_4_ = -(uint)(auVar47._4_4_ == iVar69);
        auVar50._8_4_ = -(uint)(auVar47._8_4_ == iVar70);
        auVar50._12_4_ = -(uint)(auVar47._12_4_ == iVar71);
        auVar76._4_4_ = auVar50._4_4_;
        auVar76._0_4_ = auVar50._4_4_;
        auVar76._8_4_ = auVar50._12_4_;
        auVar76._12_4_ = auVar50._12_4_;
        auVar47 = pshuflw(auVar50,auVar76,0xe8);
        auVar77._4_4_ = auVar58._4_4_;
        auVar77._0_4_ = auVar58._4_4_;
        auVar77._8_4_ = auVar58._12_4_;
        auVar77._12_4_ = auVar58._12_4_;
        auVar67 = pshuflw(auVar58,auVar77,0xe8);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 & auVar72,(auVar67 | auVar47 & auVar72) ^ auVar5);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar39[4].distance_from_desired = -1;
        }
        auVar18._4_4_ = auVar58._0_4_;
        auVar18._0_4_ = auVar58._0_4_;
        auVar18._8_4_ = auVar58._8_4_;
        auVar18._12_4_ = auVar58._8_4_;
        auVar77 = auVar76 & auVar18 | auVar77;
        auVar67 = packssdw(auVar77,auVar77);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47,auVar67 ^ auVar6);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._4_2_ >> 8 & 1) != 0) {
          psVar39[5].distance_from_desired = -1;
        }
        auVar47 = (auVar64 | auVar29) ^ auVar46;
        auVar59._0_4_ = -(uint)(iVar66 < auVar47._0_4_);
        auVar59._4_4_ = -(uint)(iVar69 < auVar47._4_4_);
        auVar59._8_4_ = -(uint)(iVar70 < auVar47._8_4_);
        auVar59._12_4_ = -(uint)(iVar71 < auVar47._12_4_);
        auVar78._4_4_ = auVar59._0_4_;
        auVar78._0_4_ = auVar59._0_4_;
        auVar78._8_4_ = auVar59._8_4_;
        auVar78._12_4_ = auVar59._8_4_;
        iVar85 = -(uint)(auVar47._4_4_ == iVar69);
        iVar89 = -(uint)(auVar47._12_4_ == iVar71);
        auVar19._4_4_ = iVar85;
        auVar19._0_4_ = iVar85;
        auVar19._8_4_ = iVar89;
        auVar19._12_4_ = iVar89;
        auVar87._4_4_ = auVar59._4_4_;
        auVar87._0_4_ = auVar59._4_4_;
        auVar87._8_4_ = auVar59._12_4_;
        auVar87._12_4_ = auVar59._12_4_;
        auVar47 = auVar19 & auVar78 | auVar87;
        auVar47 = packssdw(auVar47,auVar47);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar7,auVar47 ^ auVar7);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar39[6].distance_from_desired = -1;
        }
        auVar47 = pshufhw(auVar47,auVar78,0x84);
        auVar20._4_4_ = iVar85;
        auVar20._0_4_ = iVar85;
        auVar20._8_4_ = iVar89;
        auVar20._12_4_ = iVar89;
        auVar72 = pshufhw(auVar59,auVar20,0x84);
        auVar67 = pshufhw(auVar47,auVar87,0x84);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar67 | auVar72 & auVar47) ^ auVar51;
        auVar47 = packssdw(auVar51,auVar51);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._6_2_ >> 8 & 1) != 0) {
          psVar39[7].distance_from_desired = -1;
        }
        auVar47 = (auVar64 | auVar28) ^ auVar46;
        auVar60._0_4_ = -(uint)(iVar66 < auVar47._0_4_);
        auVar60._4_4_ = -(uint)(iVar69 < auVar47._4_4_);
        auVar60._8_4_ = -(uint)(iVar70 < auVar47._8_4_);
        auVar60._12_4_ = -(uint)(iVar71 < auVar47._12_4_);
        auVar21._4_4_ = auVar60._0_4_;
        auVar21._0_4_ = auVar60._0_4_;
        auVar21._8_4_ = auVar60._8_4_;
        auVar21._12_4_ = auVar60._8_4_;
        auVar72 = pshuflw(auVar87,auVar21,0xe8);
        auVar52._0_4_ = -(uint)(auVar47._0_4_ == iVar66);
        auVar52._4_4_ = -(uint)(auVar47._4_4_ == iVar69);
        auVar52._8_4_ = -(uint)(auVar47._8_4_ == iVar70);
        auVar52._12_4_ = -(uint)(auVar47._12_4_ == iVar71);
        auVar79._4_4_ = auVar52._4_4_;
        auVar79._0_4_ = auVar52._4_4_;
        auVar79._8_4_ = auVar52._12_4_;
        auVar79._12_4_ = auVar52._12_4_;
        auVar47 = pshuflw(auVar52,auVar79,0xe8);
        auVar80._4_4_ = auVar60._4_4_;
        auVar80._0_4_ = auVar60._4_4_;
        auVar80._8_4_ = auVar60._12_4_;
        auVar80._12_4_ = auVar60._12_4_;
        auVar67 = pshuflw(auVar60,auVar80,0xe8);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar61 = (auVar67 | auVar47 & auVar72) ^ auVar61;
        auVar67 = packssdw(auVar61,auVar61);
        auVar47 = packsswb(auVar47 & auVar72,auVar67);
        if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar39[8].distance_from_desired = -1;
        }
        auVar22._4_4_ = auVar60._0_4_;
        auVar22._0_4_ = auVar60._0_4_;
        auVar22._8_4_ = auVar60._8_4_;
        auVar22._12_4_ = auVar60._8_4_;
        auVar80 = auVar79 & auVar22 | auVar80;
        auVar67 = packssdw(auVar80,auVar80);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar67 = packssdw(auVar67 ^ auVar8,auVar67 ^ auVar8);
        auVar47 = packsswb(auVar47,auVar67);
        if ((auVar47._8_2_ >> 8 & 1) != 0) {
          psVar39[9].distance_from_desired = -1;
        }
        auVar47 = (auVar64 | auVar27) ^ auVar46;
        auVar62._0_4_ = -(uint)(iVar66 < auVar47._0_4_);
        auVar62._4_4_ = -(uint)(iVar69 < auVar47._4_4_);
        auVar62._8_4_ = -(uint)(iVar70 < auVar47._8_4_);
        auVar62._12_4_ = -(uint)(iVar71 < auVar47._12_4_);
        auVar81._4_4_ = auVar62._0_4_;
        auVar81._0_4_ = auVar62._0_4_;
        auVar81._8_4_ = auVar62._8_4_;
        auVar81._12_4_ = auVar62._8_4_;
        iVar85 = -(uint)(auVar47._4_4_ == iVar69);
        iVar89 = -(uint)(auVar47._12_4_ == iVar71);
        auVar23._4_4_ = iVar85;
        auVar23._0_4_ = iVar85;
        auVar23._8_4_ = iVar89;
        auVar23._12_4_ = iVar89;
        auVar88._4_4_ = auVar62._4_4_;
        auVar88._0_4_ = auVar62._4_4_;
        auVar88._8_4_ = auVar62._12_4_;
        auVar88._12_4_ = auVar62._12_4_;
        auVar47 = auVar23 & auVar81 | auVar88;
        auVar47 = packssdw(auVar47,auVar47);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar9,auVar47 ^ auVar9);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          psVar39[10].distance_from_desired = -1;
        }
        auVar47 = pshufhw(auVar47,auVar81,0x84);
        auVar24._4_4_ = iVar85;
        auVar24._0_4_ = iVar85;
        auVar24._8_4_ = iVar89;
        auVar24._12_4_ = iVar89;
        auVar72 = pshufhw(auVar62,auVar24,0x84);
        auVar67 = pshufhw(auVar47,auVar88,0x84);
        auVar53._8_4_ = 0xffffffff;
        auVar53._0_8_ = 0xffffffffffffffff;
        auVar53._12_4_ = 0xffffffff;
        auVar53 = (auVar67 | auVar72 & auVar47) ^ auVar53;
        auVar47 = packssdw(auVar53,auVar53);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._10_2_ >> 8 & 1) != 0) {
          psVar39[0xb].distance_from_desired = -1;
        }
        auVar47 = (auVar64 | _DAT_003e73f0) ^ auVar46;
        auVar63._0_4_ = -(uint)(iVar66 < auVar47._0_4_);
        auVar63._4_4_ = -(uint)(iVar69 < auVar47._4_4_);
        auVar63._8_4_ = -(uint)(iVar70 < auVar47._8_4_);
        auVar63._12_4_ = -(uint)(iVar71 < auVar47._12_4_);
        auVar25._4_4_ = auVar63._0_4_;
        auVar25._0_4_ = auVar63._0_4_;
        auVar25._8_4_ = auVar63._8_4_;
        auVar25._12_4_ = auVar63._8_4_;
        auVar72 = pshuflw(auVar88,auVar25,0xe8);
        auVar54._0_4_ = -(uint)(auVar47._0_4_ == iVar66);
        auVar54._4_4_ = -(uint)(auVar47._4_4_ == iVar69);
        auVar54._8_4_ = -(uint)(auVar47._8_4_ == iVar70);
        auVar54._12_4_ = -(uint)(auVar47._12_4_ == iVar71);
        auVar82._4_4_ = auVar54._4_4_;
        auVar82._0_4_ = auVar54._4_4_;
        auVar82._8_4_ = auVar54._12_4_;
        auVar82._12_4_ = auVar54._12_4_;
        auVar47 = pshuflw(auVar54,auVar82,0xe8);
        auVar83._4_4_ = auVar63._4_4_;
        auVar83._0_4_ = auVar63._4_4_;
        auVar83._8_4_ = auVar63._12_4_;
        auVar83._12_4_ = auVar63._12_4_;
        auVar67 = pshuflw(auVar63,auVar83,0xe8);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 & auVar72,(auVar67 | auVar47 & auVar72) ^ auVar10);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar39[0xc].distance_from_desired = -1;
        }
        auVar26._4_4_ = auVar63._0_4_;
        auVar26._0_4_ = auVar63._0_4_;
        auVar26._8_4_ = auVar63._8_4_;
        auVar26._12_4_ = auVar63._8_4_;
        auVar83 = auVar82 & auVar26 | auVar83;
        auVar67 = packssdw(auVar83,auVar83);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47,auVar67 ^ auVar11);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._12_2_ >> 8 & 1) != 0) {
          psVar39[0xd].distance_from_desired = -1;
        }
        auVar47 = (auVar64 | _DAT_003e73e0) ^ auVar46;
        auVar55._0_4_ = -(uint)(iVar66 < auVar47._0_4_);
        auVar55._4_4_ = -(uint)(iVar69 < auVar47._4_4_);
        auVar55._8_4_ = -(uint)(iVar70 < auVar47._8_4_);
        auVar55._12_4_ = -(uint)(iVar71 < auVar47._12_4_);
        auVar84._4_4_ = auVar55._0_4_;
        auVar84._0_4_ = auVar55._0_4_;
        auVar84._8_4_ = auVar55._8_4_;
        auVar84._12_4_ = auVar55._8_4_;
        auVar65._4_4_ = -(uint)(auVar47._4_4_ == iVar69);
        auVar65._12_4_ = -(uint)(auVar47._12_4_ == iVar71);
        auVar65._0_4_ = auVar65._4_4_;
        auVar65._8_4_ = auVar65._12_4_;
        auVar68._4_4_ = auVar55._4_4_;
        auVar68._0_4_ = auVar55._4_4_;
        auVar68._8_4_ = auVar55._12_4_;
        auVar68._12_4_ = auVar55._12_4_;
        auVar67 = auVar65 & auVar84 | auVar68;
        auVar47 = packssdw(auVar55,auVar67);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar47 = packssdw(auVar47 ^ auVar12,auVar47 ^ auVar12);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar39[0xe].distance_from_desired = -1;
        }
        auVar47 = pshufhw(auVar47,auVar84,0x84);
        in_XMM2 = pshufhw(auVar67,auVar65,0x84);
        in_XMM2 = in_XMM2 & auVar47;
        auVar47 = pshufhw(auVar47,auVar68,0x84);
        auVar56._8_4_ = 0xffffffff;
        auVar56._0_8_ = 0xffffffffffffffff;
        auVar56._12_4_ = 0xffffffff;
        auVar56 = (auVar47 | in_XMM2) ^ auVar56;
        auVar47 = packssdw(auVar56,auVar56);
        auVar47 = packsswb(auVar47,auVar47);
        if ((auVar47._14_2_ >> 8 & 1) != 0) {
          psVar39[0xf].distance_from_desired = -1;
        }
        uVar37 = uVar37 + 0x10;
        psVar39 = psVar39 + 0x10;
      } while ((uVar35 / 0x18 + 0x10 & 0xfffffffffffffff0) != uVar37);
    }
    psVar36[local_38 + (uVar41 - 1)].distance_from_desired = '\0';
    begin = this->entries;
    sVar34 = this->num_slots_minus_one;
    this->entries = psVar36;
    this->num_slots_minus_one = local_38 - 1;
    (this->hash_policy).shift = iVar33;
    max_lookups = this->max_lookups;
    this->max_lookups = bVar40;
    this->num_elements = 0;
    local_38 = sVar34;
    if (begin != begin + sVar34 + (long)max_lookups) {
      lVar38 = 0;
      do {
        if (-1 < (&begin->distance_from_desired)[lVar38]) {
          emplace<slang::SVInt>(this,(SVInt *)((long)&begin->field_1 + lVar38));
          if (((0x40 < *(uint *)((long)&begin->field_1 + lVar38 + 8)) ||
              ((*(byte *)((long)&begin->field_1 + lVar38 + 0xd) & 1) != 0)) &&
             (pvVar2 = *(void **)((long)&begin->field_1 + lVar38), pvVar2 != (void *)0x0)) {
            operator_delete__(pvVar2);
          }
          (&begin->distance_from_desired)[lVar38] = -1;
        }
        lVar38 = lVar38 + 0x18;
      } while ((long)max_lookups * 0x18 + sVar34 * 0x18 != lVar38);
    }
    deallocate_data(this,begin,local_38,max_lookups);
  }
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }